

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Storyboard.cpp
# Opt level: O1

Storyboard * __thiscall
ApprovalTests::Storyboard::addFrames
          (Storyboard *this,int numberOfFrames,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
          *function)

{
  int iVar1;
  bool bVar2;
  int local_54;
  string local_50;
  
  if (0 < numberOfFrames) {
    iVar1 = 1;
    do {
      local_54 = iVar1;
      if ((function->super__Function_base)._M_manager == (_Manager_type)0x0) {
        ::std::__throw_bad_function_call();
      }
      (*function->_M_invoker)(&local_50,(_Any_data *)function,&local_54);
      addFrame(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      bVar2 = iVar1 != numberOfFrames;
      iVar1 = iVar1 + 1;
    } while (bVar2);
  }
  return this;
}

Assistant:

Storyboard& Storyboard::addFrames(int numberOfFrames,
                                      const std::function<std::string(int)>& function)
    {
        for (int frame = 1; frame <= numberOfFrames; ++frame)
        {
            addFrame(function(frame));
        }
        return *this;
    }